

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_heat_maps.h
# Opt level: O1

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* Gudhi::Persistence_representations::create_Gaussian_filter
            (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *__return_storage_ptr__,size_t pixel_radius,double sigma)

{
  size_type __n;
  pointer pvVar1;
  long lVar2;
  size_t sVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  size_t sVar10;
  double dVar11;
  undefined1 auVar12 [16];
  vector<double,_std::allocator<double>_> v;
  allocator_type local_ad;
  int local_ac;
  size_t local_a8;
  double local_a0;
  int local_98;
  int local_94;
  long local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  value_type_conflict1 local_68;
  vector<double,_std::allocator<double>_> local_60;
  double local_48;
  double dStack_40;
  
  __n = pixel_radius * 2 + 1;
  local_a8 = pixel_radius;
  local_a0 = sigma;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,__n,(allocator_type *)&local_60);
  if ((__return_storage_ptr__->
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (__return_storage_ptr__->
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    lVar9 = 0;
    lVar8 = 0;
    do {
      local_68 = 0.0;
      std::vector<double,_std::allocator<double>_>::vector(&local_60,__n,&local_68,&local_ad);
      std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((__return_storage_ptr__->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar9),&local_60);
      if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0x18;
    } while (lVar8 != ((long)(__return_storage_ptr__->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(__return_storage_ptr__->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
    ;
  }
  sVar3 = local_a8;
  iVar7 = (int)local_a8;
  local_ac = -iVar7;
  local_70 = 0.0;
  if (local_ac <= iVar7) {
    local_80 = local_a0 * local_a0;
    auVar12._8_4_ = (int)(local_a8 >> 0x20);
    auVar12._0_8_ = local_a8;
    auVar12._12_4_ = 0x45300000;
    local_a0 = local_a0 + local_a0;
    dStack_40 = auVar12._8_8_ - 1.9342813113834067e+25;
    local_48 = dStack_40 + ((double)CONCAT44(0x43300000,iVar7) - 4503599627370496.0);
    local_88 = local_80 * 3.141592;
    lVar8 = (long)local_ac;
    local_94 = iVar7 + 1;
    local_98 = iVar7 * 2 + 1;
    local_70 = 0.0;
    local_a8 = local_a8 + lVar8;
    do {
      local_78 = ((double)(int)lVar8 * local_a0) / local_48;
      local_78 = local_78 * local_78;
      sVar10 = local_a8;
      iVar7 = local_98;
      iVar4 = local_ac;
      local_90 = lVar8;
      do {
        dVar11 = ((double)iVar4 * local_a0) / local_48;
        dVar11 = dVar11 * dVar11 + local_78;
        if (dVar11 < 0.0) {
          dVar11 = sqrt(dVar11);
        }
        else {
          dVar11 = SQRT(dVar11);
        }
        dVar11 = exp((-dVar11 * dVar11) / local_80);
        *(double *)
         (*(long *)&(__return_storage_ptr__->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[lVar8 + sVar3].
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data + sVar10 * 8) = dVar11 / local_88;
        local_70 = local_70 + dVar11 / local_88;
        sVar10 = sVar10 + 1;
        iVar4 = iVar4 + 1;
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
      lVar8 = local_90 + 1;
    } while (local_94 != (int)lVar8);
  }
  pvVar1 = (__return_storage_ptr__->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(__return_storage_ptr__->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
  if (lVar8 != 0) {
    lVar9 = 0;
    do {
      lVar2 = *(long *)&pvVar1[lVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      lVar5 = (long)*(pointer *)
                     ((long)&pvVar1[lVar9].super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data + 8) - lVar2;
      if (lVar5 != 0) {
        lVar6 = 0;
        do {
          *(double *)(lVar2 + lVar6 * 8) = *(double *)(lVar2 + lVar6 * 8) / local_70;
          lVar6 = lVar6 + 1;
        } while (lVar5 >> 3 != lVar6);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != (lVar8 >> 3) * -0x5555555555555555);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<double> > create_Gaussian_filter(size_t pixel_radius, double sigma) {
  bool dbg = false;
  // we are computing the kernel mask to 2 standard deviations away from the center. We discretize it in a grid of a
  // size 2*pixel_radius times 2*pixel_radius.

  double r = 0;
  double sigma_sqr = sigma * sigma;

  // sum is for normalization
  double sum = 0;

  // initialization of a kernel:
  std::vector<std::vector<double> > kernel(2 * pixel_radius + 1);
  for (size_t i = 0; i != kernel.size(); ++i) {
    std::vector<double> v(2 * pixel_radius + 1, 0);
    kernel[i] = v;
  }

  if (dbg) {
    std::clog << "Kernel initialize \n";
    std::clog << "pixel_radius : " << pixel_radius << std::endl;
    std::clog << "kernel.size() : " << kernel.size() << std::endl;
    getchar();
  }

  for (int x = -pixel_radius; x <= static_cast<int>(pixel_radius); x++) {
    for (int y = -pixel_radius; y <= static_cast<int>(pixel_radius); y++) {
      double real_x = 2 * sigma * x / pixel_radius;
      double real_y = 2 * sigma * y / pixel_radius;
      r = std::sqrt(real_x * real_x + real_y * real_y);
      kernel[x + pixel_radius][y + pixel_radius] = (exp(-(r * r) / sigma_sqr)) / (3.141592 * sigma_sqr);
      sum += kernel[x + pixel_radius][y + pixel_radius];
    }
  }

  // normalize the kernel
  for (size_t i = 0; i != kernel.size(); ++i) {
    for (size_t j = 0; j != kernel[i].size(); ++j) {
      kernel[i][j] /= sum;
    }
  }

  if (dbg) {
    std::clog << "Here is the kernel : \n";
    for (size_t i = 0; i != kernel.size(); ++i) {
      for (size_t j = 0; j != kernel[i].size(); ++j) {
        std::clog << kernel[i][j] << " ";
      }
      std::clog << std::endl;
    }
  }
  return kernel;
}